

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationCommonEdgeTests.cpp
# Opt level: O3

TestCaseGroup * vkt::tessellation::createCommonEdgeTests(TestContext *testCtx)

{
  ShaderType SVar1;
  char *pcVar2;
  TestContext *testCtx_00;
  bool bVar3;
  bool bVar4;
  long *description;
  bool bVar5;
  bool bVar6;
  TestNode *this;
  size_t sVar7;
  TestNode *node;
  char *pcVar8;
  long lVar9;
  undefined4 local_1f8;
  pointer local_1f0;
  long *local_1c8;
  long local_1b8 [2];
  long *local_1a8 [2];
  long local_198 [12];
  ios_base local_138 [264];
  
  this = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)this,testCtx,"common_edge",
             "Draw multiple adjacent shapes and check that no cracks appear between them");
  lVar9 = 0;
  bVar5 = true;
  do {
    bVar4 = bVar5;
    SVar1 = createCommonEdgeTests(tcu::TestContext&)::primitiveTypes[lVar9];
    bVar6 = false;
    local_1f8 = 0;
    bVar5 = true;
    do {
      bVar3 = bVar5;
      pcVar8 = "";
      if (bVar6) {
        pcVar8 = "_precise";
      }
      lVar9 = 0;
      local_1f0 = (pointer)(ulong)SVar1;
      do {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        pcVar2 = *(char **)(&DAT_00d001c0 + (long)(int)SVar1 * 8);
        sVar7 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar7);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
        pcVar2 = *(char **)((long)&PTR_anon_var_dwarf_15bb72c_00d001d8 + lVar9);
        sVar7 = strlen(pcVar2);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,pcVar2,sVar7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,pcVar8,(ulong)bVar6 << 3);
        std::__cxx11::stringbuf::str();
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        local_1a8[0] = local_198;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
        description = local_1a8[0];
        testCtx_00 = this->m_testCtx;
        node = (TestNode *)operator_new(0x90);
        tcu::TestCase::TestCase
                  ((TestCase *)node,testCtx_00,NODETYPE_SELF_VALIDATE,(char *)local_1c8,
                   (char *)description);
        node->_vptr_TestNode = (_func_int **)&PTR__TestCase_00d00130;
        node[1]._vptr_TestNode = (_func_int **)anon_unknown_2::initPrograms;
        node[1].m_testCtx = (TestContext *)anon_unknown_2::test;
        node[1].m_name._M_dataplus._M_p = local_1f0;
        *(undefined4 *)&node[1].m_name._M_string_length = local_1f8;
        tcu::TestNode::addChild(this,node);
        if (local_1a8[0] != local_198) {
          operator_delete(local_1a8[0],local_198[0] + 1);
        }
        if (local_1c8 != local_1b8) {
          operator_delete(local_1c8,local_1b8[0] + 1);
        }
        lVar9 = lVar9 + 8;
        local_1f0 = local_1f0 + 0x100000000;
      } while (lVar9 != 0x18);
      local_1f8 = 1;
      bVar6 = true;
      bVar5 = false;
    } while (bVar3);
    lVar9 = 1;
    bVar5 = false;
  } while (bVar4);
  return (TestCaseGroup *)this;
}

Assistant:

tcu::TestCaseGroup* createCommonEdgeTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "common_edge", "Draw multiple adjacent shapes and check that no cracks appear between them"));

	static const TessPrimitiveType primitiveTypes[] =
	{
		TESSPRIMITIVETYPE_TRIANGLES,
		TESSPRIMITIVETYPE_QUADS,
	};

	for (int primitiveTypeNdx = 0; primitiveTypeNdx < DE_LENGTH_OF_ARRAY(primitiveTypes); ++primitiveTypeNdx)
	for (int caseTypeNdx = 0; caseTypeNdx < CASETYPE_LAST; ++caseTypeNdx)
	for (int spacingModeNdx = 0; spacingModeNdx < SPACINGMODE_LAST; ++spacingModeNdx)
	{
		const TessPrimitiveType primitiveType = primitiveTypes[primitiveTypeNdx];
		const CaseType			caseType	  = static_cast<CaseType>(caseTypeNdx);
		const SpacingMode		spacingMode   = static_cast<SpacingMode>(spacingModeNdx);
		const CaseDefinition	caseDef		  = { primitiveType, spacingMode, caseType };

		addFunctionCaseWithPrograms(group.get(), getCaseName(primitiveType, spacingMode, caseType), "", initPrograms, test, caseDef);
	}

	return group.release();
}